

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O2

int __thiscall
basisu::basisu_backend::find_video_frame(basisu_backend *this,int slice_index,int delta)

{
  basisu_backend_slice_desc_vec *this_00;
  bool bVar1;
  uint32_t uVar2;
  basisu_backend_slice_desc *pbVar3;
  size_t i;
  uint32_t s;
  ulong i_00;
  
  this_00 = &this->m_slices;
  i = (size_t)slice_index;
  i_00 = 0;
  do {
    if ((this->m_slices).m_size <= i_00) {
      return -1;
    }
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i_00);
    uVar2 = pbVar3->m_source_file_index;
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
    if (uVar2 == pbVar3->m_source_file_index + delta) {
      pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i_00);
      uVar2 = pbVar3->m_mip_index;
      pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
      if (uVar2 == pbVar3->m_mip_index) {
        pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i_00);
        uVar2 = pbVar3->m_num_blocks_x;
        pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
        if (uVar2 == pbVar3->m_num_blocks_x) {
          pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i_00);
          uVar2 = pbVar3->m_num_blocks_y;
          pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
          if (uVar2 == pbVar3->m_num_blocks_y) {
            pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i_00);
            bVar1 = pbVar3->m_alpha;
            pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
            if (bVar1 == pbVar3->m_alpha) {
              return (int)i_00;
            }
          }
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

int basisu_backend::find_video_frame(int slice_index, int delta)
	{
		for (uint32_t s = 0; s < m_slices.size(); s++)
		{
			if ((int)m_slices[s].m_source_file_index != ((int)m_slices[slice_index].m_source_file_index + delta))
				continue;
			if (m_slices[s].m_mip_index != m_slices[slice_index].m_mip_index)
				continue;

			// Being super paranoid here.
			if (m_slices[s].m_num_blocks_x != (m_slices[slice_index].m_num_blocks_x))
				continue;
			if (m_slices[s].m_num_blocks_y != (m_slices[slice_index].m_num_blocks_y))
				continue;
			if (m_slices[s].m_alpha != (m_slices[slice_index].m_alpha))
				continue;
			return s;
		}

		return -1;
	}